

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

int sha1_result(sha1_context *context,uint8_t *Message_Digest)

{
  byte local_22;
  byte local_21;
  uint_fast8_t i_1;
  uint_fast8_t i;
  uint8_t *Message_Digest_local;
  sha1_context *context_local;
  
  if ((context == (sha1_context *)0x0) || (Message_Digest == (uint8_t *)0x0)) {
    context_local._4_4_ = 1;
  }
  else if (context->corrupted == 0) {
    if (context->computed == 0) {
      sha1_pad_message(context);
      for (local_21 = 0; local_21 < 0x40; local_21 = local_21 + 1) {
        context->message_block[local_21] = '\0';
      }
      context->length_low = 0;
      context->length_high = 0;
      context->computed = 1;
    }
    for (local_22 = 0; local_22 < 0x14; local_22 = local_22 + 1) {
      Message_Digest[local_22] =
           (uint8_t)(context->intermediate_hash[(int)(uint)local_22 >> 2] >>
                    (('\x03' - (local_22 & 3)) * '\b' & 0x1f));
    }
    context_local._4_4_ = 0;
  }
  else {
    context_local._4_4_ = context->corrupted;
  }
  return context_local._4_4_;
}

Assistant:

int sha1_result(sha1_context *context,
                uint8_t Message_Digest[SHA1_HASH_SIZE])
{
	if ((!context) || (!Message_Digest)) {
		return SHA_NULL;
	}

	if (context->corrupted) {
		return context->corrupted;
	}

	if (!context->computed) {
		sha1_pad_message(context);
		for (uint_fast8_t i = 0; i < 64; ++i) {
			/* message may be sensitive, clear it out */
			context->message_block[i] = 0;
		}
		context->length_low = 0; /* and clear length */
		context->length_high = 0;
		context->computed = 1;
	}

	for (uint_fast8_t i = 0; i < SHA1_HASH_SIZE; ++i) {
		Message_Digest[i] = (uint8_t)(context->intermediate_hash[i >> 2U] >> 8 * (3 - (i & 0x03U)));
	}

	return SHA_SUCCESS;
}